

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::ExpressionsLength3<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (ExpressionsLength3<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  TestError *this_00;
  long lVar1;
  string *tested_snippet;
  long *plVar2;
  string array_declaration;
  string shader_source;
  string input [3];
  string local_100;
  string local_e0;
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined1 local_b0;
  undefined7 uStack_af;
  ulong local_a0;
  string local_98;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  long *local_58 [2];
  long local_48 [3];
  
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,"    int x[1][1][1][1];\n\n","");
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"    if (x[].length() != 2) {\n        result = 0.0f;\n    }\n","")
  ;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"    if (x[][].length() != 2)  {\n        result = 0.0f;\n    }\n",
             "");
  plVar2 = local_48;
  local_58[0] = plVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"    if (x[][][].length() != 2)  {\n        result = 0.0f;\n    }\n"
             ,"");
  lVar1 = 0;
  local_a0 = (ulong)tested_shader_type;
  do {
    local_c0 = &local_b0;
    local_b8 = 0;
    local_b0 = 0;
    if (TESSELATION_EVALUATION_SHADER_TYPE < tested_shader_type) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x10dd);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    tested_snippet = (string *)((long)&local_98._M_dataplus._M_p + lVar1);
    switch((long)&switchD_00b3e4d6::switchdataD_01b0df60 +
           (long)(int)(&switchD_00b3e4d6::switchdataD_01b0df60)[local_a0]) {
    case 0xb3e4d8:
      ExpressionsLength1<glcts::ArraysOfArrays::Interface::ES>::prepare_fragment_shader
                (&local_100,&this->super_ExpressionsLength1<glcts::ArraysOfArrays::Interface::ES>,
                 FRAGMENT_SHADER_TYPE,&local_e0,tested_snippet);
      break;
    case 0xb3e4ec:
      ExpressionsLength1<glcts::ArraysOfArrays::Interface::ES>::prepare_tess_ctrl_shader
                (&local_100,&this->super_ExpressionsLength1<glcts::ArraysOfArrays::Interface::ES>,
                 TESSELATION_CONTROL_SHADER_TYPE,&local_e0,tested_snippet);
      break;
    case 0xb3e503:
      ExpressionsLength1<glcts::ArraysOfArrays::Interface::ES>::prepare_compute_shader
                (&local_100,&this->super_ExpressionsLength1<glcts::ArraysOfArrays::Interface::ES>,
                 COMPUTE_SHADER_TYPE,&local_e0,tested_snippet);
      break;
    case 0xb3e51a:
      ExpressionsLength1<glcts::ArraysOfArrays::Interface::ES>::prepare_geometry_shader
                (&local_100,&this->super_ExpressionsLength1<glcts::ArraysOfArrays::Interface::ES>,
                 GEOMETRY_SHADER_TYPE,&local_e0,tested_snippet);
      break;
    case 0xb3e531:
      ExpressionsLength1<glcts::ArraysOfArrays::Interface::ES>::prepare_vertex_shader
                (&local_100,&this->super_ExpressionsLength1<glcts::ArraysOfArrays::Interface::ES>,
                 VERTEX_SHADER_TYPE,&local_e0,tested_snippet);
      break;
    case 0xb3e548:
      ExpressionsLength1<glcts::ArraysOfArrays::Interface::ES>::prepare_tess_eval_shader
                (&local_100,&this->super_ExpressionsLength1<glcts::ArraysOfArrays::Interface::ES>,
                 TESSELATION_EVALUATION_SHADER_TYPE,&local_e0,tested_snippet);
    }
    std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    (*(this->super_ExpressionsLength1<glcts::ArraysOfArrays::Interface::ES>).
      super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>.super_TestCase.super_TestNode.
      _vptr_TestNode[8])(this,(ulong)tested_shader_type,(string *)&local_c0);
    if (local_c0 != &local_b0) {
      operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
    }
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x60);
  lVar1 = -0x60;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -4;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ExpressionsLength3<API>::test_shader_compilation(typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string array_declaration = "    int x[1][1][1][1];\n\n";
	std::string input[]			  = { "    if (x[].length() != 2) {\n"
							"        result = 0.0f;\n    }\n",
							"    if (x[][].length() != 2)  {\n"
							"        result = 0.0f;\n    }\n",
							"    if (x[][][].length() != 2)  {\n"
							"        result = 0.0f;\n    }\n" };

	for (size_t string_index = 0; string_index < sizeof(input) / sizeof(input[0]); string_index++)
	{
		std::string		   shader_source;
		const std::string& test_snippet = input[string_index];

		switch (tested_shader_type)
		{
		case TestCaseBase<API>::VERTEX_SHADER_TYPE:
			shader_source = this->prepare_vertex_shader(tested_shader_type, array_declaration, test_snippet);
			break;

		case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
			shader_source = this->prepare_fragment_shader(tested_shader_type, array_declaration, test_snippet);
			break;

		case TestCaseBase<API>::COMPUTE_SHADER_TYPE:
			shader_source = this->prepare_compute_shader(tested_shader_type, array_declaration, test_snippet);
			break;

		case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
			shader_source = this->prepare_geometry_shader(tested_shader_type, array_declaration, test_snippet);
			break;

		case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE:
			shader_source = this->prepare_tess_ctrl_shader(tested_shader_type, array_declaration, test_snippet);
			break;

		case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
			shader_source = this->prepare_tess_eval_shader(tested_shader_type, array_declaration, test_snippet);
			break;

		default:
			TCU_FAIL("Unrecognized shader type.");
			break;
		} /* switch (tested_shader_type) */

		this->execute_negative_test(tested_shader_type, shader_source);
	} /* for (int string_index = 0; ...) */
}